

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_service.cc
# Opt level: O3

ps_err_e ps_pstop(ps_prochandle *ph)

{
  (**(code **)(*(long *)ph + 0x30))();
  return PS_OK;
}

Assistant:

ps_err_e
ps_pstop(const struct ps_prochandle *ph)
{
    auto *p = const_cast<Process *>(static_cast<const Process *>(ph));
    try {
        p->stopProcess();
        return PS_OK;
    } catch (...) {
        return PS_ERR;
    }
}